

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

OpacityNode * rengine::OpacityNode::create(void)

{
  undefined1 *puVar1;
  OpacityNode *pOVar2;
  
  if (__allocation_pool_rengine_OpacityNode.m_nextFree <
      __allocation_pool_rengine_OpacityNode.m_poolSize) {
    pOVar2 = AllocationPool<rengine::OpacityNode>::allocate(&__allocation_pool_rengine_OpacityNode);
    puVar1 = &(pOVar2->super_Node).field_0x31;
    *puVar1 = *puVar1 | 2;
  }
  else {
    pOVar2 = (OpacityNode *)operator_new(0x38);
    (pOVar2->super_Node).super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    (pOVar2->super_Node).m_parent = (Node *)0x0;
    (pOVar2->super_Node).m_child = (Node *)0x0;
    (pOVar2->super_Node).m_next = (Node *)0x0;
    (pOVar2->super_Node).m_prev = (Node *)0x0;
    *(uint *)&(pOVar2->super_Node).field_0x30 =
         *(uint *)&(pOVar2->super_Node).field_0x30 & 0xfffff800 | 2;
    (pOVar2->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)&PTR__Node_0012dbf8
    ;
    *(undefined4 *)&(pOVar2->super_Node).field_0x34 = 0x3f800000;
  }
  return pOVar2;
}

Assistant:

static OpacityNode *create(float opacity) {
        auto node = create();
        node->setOpacity(opacity);
        return node;
    }